

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FieldBaseTestCase.cpp
# Opt level: O0

void __thiscall SuiteFieldBaseTests::Testset::Testset(Testset *this)

{
  char *suiteName;
  Testset *this_local;
  
  suiteName = SuiteFieldBaseTests::UnitTestSuite::GetSuiteName();
  UnitTest::Test::Test
            (&this->super_Test,"set",suiteName,
             "/workspace/llm4binary/github/license_all_cmakelists_25/marlowa[P]quickfix/src/C++/test/FieldBaseTestCase.cpp"
             ,0x23);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__Testset_00457470;
  return;
}

Assistant:

TEST(set)
{
  FieldBase object( 12, "VALUE" );
  object.setString( "VALUE" );
  CHECK_EQUAL( "12=VALUE\001", object.getFixString() );
  CHECK_EQUAL( 542, object.getTotal() );
  CHECK_EQUAL( 9lu, object.getLength() );
  object.setString( "VALUF" );
  CHECK_EQUAL( "12=VALUF\001", object.getFixString() );
  CHECK_EQUAL( 543, object.getTotal() );
  CHECK_EQUAL( 9lu, object.getLength() );
  object.setTag( 13 );
  CHECK_EQUAL( "13=VALUF\001", object.getFixString() );
  CHECK_EQUAL( 544, object.getTotal() );
  CHECK_EQUAL( 9lu, object.getLength() );
}